

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall xLearn::InmemReader::Initialize(InmemReader *this,string *filename)

{
  string *filename_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  InmemReader *this_00;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  undefined1 local_58 [32];
  string local_38;
  
  if (filename->_M_string_length != 0) {
    filename_00 = &(this->super_Reader).filename_;
    std::__cxx11::string::_M_assign((string *)filename_00);
    std::__cxx11::string::string
              ((string *)local_58,
               "First check if the text file has been already converted to binary format.",
               (allocator *)&local_38);
    Color::print_info((string *)local_58,false);
    this_00 = (InmemReader *)local_58;
    std::__cxx11::string::~string((string *)this_00);
    bVar1 = hash_binary(this_00,filename_00);
    if (bVar1) {
      StringPrintf_abi_cxx11_
                ((string *)local_58,"Binary file (%s.bin) found. Skip converting text to binary.",
                 (filename_00->_M_dataplus)._M_p);
      Color::print_info((string *)local_58,false);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::append((char *)filename_00);
      init_from_binary(this);
    }
    else {
      StringPrintf_abi_cxx11_
                ((string *)local_58,
                 "Binary file (%s.bin) NOT found. Convert text file to binary file.",
                 (filename_00->_M_dataplus)._M_p);
      Color::print_info((string *)local_58,false);
      std::__cxx11::string::~string((string *)local_58);
      pcVar2 = (char *)malloc((this->super_Reader).block_size_ << 0x14);
      (this->super_Reader).block_ = pcVar2;
      init_from_txt(this);
    }
    return;
  }
  local_5c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
             ,&local_5d);
  std::__cxx11::string::string((string *)&local_38,"Initialize",&local_5e);
  poVar3 = Logger::Start(ERR,(string *)local_58,0x7f,&local_38);
  poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7f);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"filename.empty()");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"true");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)local_58);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

void InmemReader::Initialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true)
  filename_ = filename;
  Color::print_info("First check if the text file has been already "
                    "converted to binary format.");
  // HashBinary() will read the first two hash value
  // and then check it whether equal to the hash value generated
  // by HashFile() function from current txt file.
  if (hash_binary(filename_)) {
    Color::print_info(
      StringPrintf("Binary file (%s.bin) found. "
                   "Skip converting text to binary.",
                   filename_.c_str())
    );
    filename_ += ".bin";
    init_from_binary();
  } else {
    Color::print_info(
      StringPrintf("Binary file (%s.bin) NOT found. Convert text "
                   "file to binary file.",
                   filename_.c_str())
    );
    // Allocate memory for block
    try {
      this->block_ = (char*)malloc(block_size_*1024*1024);
    } catch (std::bad_alloc&) {
      LOG(FATAL) << "Cannot allocate enough memory for data  \
                     block. Block size: " 
                 << block_size_ << "MB. "
                 << "You set change the block size via configuration.";
    }
    init_from_txt();
  }
}